

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<double,duckdb::string_t>,double,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (double *adata,AggregateInputData *aggr_input_data,string_t *bdata,
               ArgMinMaxState<double,_duckdb::string_t> **states,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,SelectionVector *ssel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  AggregateBinaryInput *pAVar4;
  anon_union_16_2_67f50693_for_value local_58;
  ValidityMask *local_48;
  ulong local_40;
  ulong local_38;
  
  local_58.pointer.ptr = (char *)avalidity;
  local_48 = bvalidity;
  local_58._0_8_ = aggr_input_data;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = 0;
      pAVar4 = (AggregateBinaryInput *)count;
      do {
        local_40 = uVar3;
        if (asel->sel_vector != (sel_t *)0x0) {
          local_40 = (ulong)asel->sel_vector[uVar3];
        }
        local_38 = uVar3;
        if (bsel->sel_vector != (sel_t *)0x0) {
          local_38 = (ulong)bsel->sel_vector[uVar3];
        }
        uVar2 = uVar3;
        if (ssel->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)ssel->sel_vector[uVar3];
        }
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  ((ArgMinMaxBase<duckdb::GreaterThan,true> *)states[uVar2],
                   (ArgMinMaxState<double,_duckdb::string_t> *)(adata + local_40),
                   (double *)(bdata + local_38),(string_t *)&local_58.pointer,pAVar4);
        uVar3 = uVar3 + 1;
      } while (count != uVar3);
    }
  }
  else if (count != 0) {
    uVar3 = 0;
    pAVar4 = (AggregateBinaryInput *)count;
    do {
      local_40 = uVar3;
      if (asel->sel_vector != (sel_t *)0x0) {
        local_40 = (ulong)asel->sel_vector[uVar3];
      }
      local_38 = uVar3;
      if (bsel->sel_vector != (sel_t *)0x0) {
        local_38 = (ulong)bsel->sel_vector[uVar3];
      }
      uVar2 = uVar3;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)ssel->sel_vector[uVar3];
      }
      puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar1 == (unsigned_long *)0x0) ||
          ((puVar1[local_40 >> 6] >> (local_40 & 0x3f) & 1) != 0)) &&
         ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar1 == (unsigned_long *)0x0 || ((puVar1[local_38 >> 6] >> (local_38 & 0x3f) & 1) != 0))
         )) {
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  ((ArgMinMaxBase<duckdb::GreaterThan,true> *)states[uVar2],
                   (ArgMinMaxState<double,_duckdb::string_t> *)(adata + local_40),
                   (double *)(bdata + local_38),(string_t *)&local_58.pointer,pAVar4);
      }
      uVar3 = uVar3 + 1;
    } while (count != uVar3);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}